

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder_Declarators.cpp
# Opt level: O0

Action __thiscall
psy::C::DeclarationBinder::visitArrayOrFunctionDeclarator
          (DeclarationBinder *this,ArrayOrFunctionDeclaratorSyntax *node)

{
  Action AVar1;
  bool bVar2;
  TypeKind TVar3;
  SyntaxKind SVar4;
  CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
  *pCVar5;
  SyntaxNode *pSVar6;
  Type *ty_00;
  reference ppTVar7;
  ostream *poVar8;
  Type *local_b8;
  FunctionType *funcTy;
  SyntaxToken local_68;
  Type *local_30;
  value_type ty_1;
  value_type ty;
  ArrayOrFunctionDeclaratorSyntax *node_local;
  DeclarationBinder *this_local;
  
  ty = (value_type)node;
  node_local = (ArrayOrFunctionDeclaratorSyntax *)this;
  pCVar5 = &ArrayOrFunctionDeclaratorSyntax::attributes(node)->
            super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
  ;
  AVar1 = SyntaxVisitor::
          visit<psy::C::SpecifierSyntax*,psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax*>>
                    (&this->super_SyntaxVisitor,pCVar5);
  if (AVar1 == Quit) {
    this_local._7_1_ = Quit;
  }
  else {
    pSVar6 = &ArrayOrFunctionDeclaratorSyntax::suffix((ArrayOrFunctionDeclaratorSyntax *)ty)->
              super_SyntaxNode;
    SVar4 = C::SyntaxNode::kind(pSVar6);
    if (SVar4 == SubscriptSuffix) {
      bVar2 = std::
              stack<psy::C::Type_*,_std::deque<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>_>::
              empty(&this->tys_);
      if (bVar2) {
        poVar8 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
        poVar8 = std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
                                );
        poVar8 = std::operator<<(poVar8,":");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf6);
        poVar8 = std::operator<<(poVar8," ");
        poVar8 = std::operator<<(poVar8,"<empty message>");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = Quit;
      }
      else {
        ppTVar7 = std::
                  stack<psy::C::Type_*,_std::deque<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>_>
                  ::top(&this->tys_);
        if (*ppTVar7 == (value_type)0x0) {
          poVar8 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
          poVar8 = std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
                                  );
          poVar8 = std::operator<<(poVar8,":");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf6);
          poVar8 = std::operator<<(poVar8," ");
          poVar8 = std::operator<<(poVar8,"<empty message>");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          this_local._7_1_ = Quit;
        }
        else {
          ppTVar7 = std::
                    stack<psy::C::Type_*,_std::deque<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>_>
                    ::top(&this->tys_);
          ty_1 = *ppTVar7;
          ty_00 = &makeType<psy::C::ArrayType,psy::C::Type*>(this,ty_1)->super_Type;
          pushType(this,ty_00);
          pSVar6 = &ArrayOrFunctionDeclaratorSyntax::innerDeclarator
                              ((ArrayOrFunctionDeclaratorSyntax *)ty)->super_SyntaxNode;
          AVar1 = SyntaxVisitor::visit(&this->super_SyntaxVisitor,pSVar6);
          if (AVar1 == Quit) {
            this_local._7_1_ = Quit;
          }
          else {
            pCVar5 = &ArrayOrFunctionDeclaratorSyntax::attributes_PostDeclarator
                                ((ArrayOrFunctionDeclaratorSyntax *)ty)->
                      super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
            ;
            AVar1 = SyntaxVisitor::
                    visit<psy::C::SpecifierSyntax*,psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax*>>
                              (&this->super_SyntaxVisitor,pCVar5);
            if (AVar1 == Quit) {
              this_local._7_1_ = Quit;
            }
            else {
              pSVar6 = &ArrayOrFunctionDeclaratorSyntax::initializer
                                  ((ArrayOrFunctionDeclaratorSyntax *)ty)->super_SyntaxNode;
              AVar1 = SyntaxVisitor::visit(&this->super_SyntaxVisitor,pSVar6);
              if (AVar1 == Quit) {
                this_local._7_1_ = Quit;
              }
              else {
                this_local._7_1_ = Skip;
              }
            }
          }
        }
      }
    }
    else if (SVar4 == ParameterSuffix) {
      bVar2 = std::
              stack<psy::C::Type_*,_std::deque<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>_>::
              empty(&this->tys_);
      if (bVar2) {
        poVar8 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
        poVar8 = std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
                                );
        poVar8 = std::operator<<(poVar8,":");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xff);
        poVar8 = std::operator<<(poVar8," ");
        poVar8 = std::operator<<(poVar8,"<empty message>");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = Quit;
      }
      else {
        ppTVar7 = std::
                  stack<psy::C::Type_*,_std::deque<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>_>
                  ::top(&this->tys_);
        if (*ppTVar7 == (value_type)0x0) {
          poVar8 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
          poVar8 = std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
                                  );
          poVar8 = std::operator<<(poVar8,":");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xff);
          poVar8 = std::operator<<(poVar8," ");
          poVar8 = std::operator<<(poVar8,"<empty message>");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          this_local._7_1_ = Quit;
        }
        else {
          ppTVar7 = std::
                    stack<psy::C::Type_*,_std::deque<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>_>
                    ::top(&this->tys_);
          local_30 = *ppTVar7;
          TVar3 = Type::kind(local_30);
          switch(TVar3) {
          case Array:
            pSVar6 = &ArrayOrFunctionDeclaratorSyntax::innerDeclarator
                                ((ArrayOrFunctionDeclaratorSyntax *)ty)->super_SyntaxNode;
            C::SyntaxNode::firstToken((SyntaxToken *)&funcTy,pSVar6);
            DiagnosticsReporter::FunctionReturningArray(&this->diagReporter_,(SyntaxToken *)&funcTy)
            ;
            SyntaxToken::~SyntaxToken((SyntaxToken *)&funcTy);
            break;
          case Basic:
          case Pointer:
          case TypedefName:
          case Tag:
          case Void:
          case Qualified:
            break;
          case Function:
            pSVar6 = &ArrayOrFunctionDeclaratorSyntax::innerDeclarator
                                ((ArrayOrFunctionDeclaratorSyntax *)ty)->super_SyntaxNode;
            C::SyntaxNode::firstToken(&local_68,pSVar6);
            DiagnosticsReporter::FunctionReturningFunction(&this->diagReporter_,&local_68);
            SyntaxToken::~SyntaxToken(&local_68);
            break;
          case Error:
            poVar8 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
            poVar8 = std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
                                    );
            poVar8 = std::operator<<(poVar8,":");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x114);
            poVar8 = std::operator<<(poVar8," ");
            poVar8 = std::operator<<(poVar8,"<empty message>");
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            return Quit;
          }
          local_b8 = &makeType<psy::C::FunctionType,psy::C::Type*>(this,local_30)->super_Type;
          pushType(this,local_b8);
          std::
          stack<psy::C::FunctionType_*,_std::deque<psy::C::FunctionType_*,_std::allocator<psy::C::FunctionType_*>_>_>
          ::push(&this->pendingFuncTys_,(value_type *)&local_b8);
          pSVar6 = &ArrayOrFunctionDeclaratorSyntax::innerDeclarator
                              ((ArrayOrFunctionDeclaratorSyntax *)ty)->super_SyntaxNode;
          AVar1 = SyntaxVisitor::visit(&this->super_SyntaxVisitor,pSVar6);
          if (AVar1 == Quit) {
            this_local._7_1_ = Quit;
          }
          else {
            pCVar5 = &ArrayOrFunctionDeclaratorSyntax::attributes_PostDeclarator
                                ((ArrayOrFunctionDeclaratorSyntax *)ty)->
                      super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
            ;
            AVar1 = SyntaxVisitor::
                    visit<psy::C::SpecifierSyntax*,psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax*>>
                              (&this->super_SyntaxVisitor,pCVar5);
            if (AVar1 == Quit) {
              this_local._7_1_ = Quit;
            }
            else {
              pSVar6 = &ArrayOrFunctionDeclaratorSyntax::initializer
                                  ((ArrayOrFunctionDeclaratorSyntax *)ty)->super_SyntaxNode;
              AVar1 = SyntaxVisitor::visit(&this->super_SyntaxVisitor,pSVar6);
              if (AVar1 == Quit) {
                this_local._7_1_ = Quit;
              }
              else {
                pushNewScope(this,(SyntaxNode *)ty,FunctionPrototype,true);
                pSVar6 = &ArrayOrFunctionDeclaratorSyntax::suffix
                                    ((ArrayOrFunctionDeclaratorSyntax *)ty)->super_SyntaxNode;
                AVar1 = SyntaxVisitor::visit(&this->super_SyntaxVisitor,pSVar6);
                if (AVar1 == Quit) {
                  this_local._7_1_ = Quit;
                }
                else {
                  popAndStashScope(this);
                  std::
                  stack<psy::C::FunctionType_*,_std::deque<psy::C::FunctionType_*,_std::allocator<psy::C::FunctionType_*>_>_>
                  ::pop(&this->pendingFuncTys_);
                  this_local._7_1_ = Skip;
                }
              }
            }
          }
        }
      }
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar8 = std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
                              );
      poVar8 = std::operator<<(poVar8,":");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x127);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = std::operator<<(poVar8,"<empty message>");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = Quit;
    }
  }
  return this_local._7_1_;
}

Assistant:

SyntaxVisitor::Action DeclarationBinder::visitArrayOrFunctionDeclarator(const ArrayOrFunctionDeclaratorSyntax* node)
{
    VISIT(node->attributes());

    switch (node->suffix()->kind()) {
        case SyntaxKind::SubscriptSuffix: {
            TY_AT_TOP(auto ty, Action::Quit);
            pushType(makeType<ArrayType>(ty));
            VISIT(node->innerDeclarator());
            VISIT(node->attributes_PostDeclarator());
            VISIT(node->initializer());
            return Action::Skip;
        }

        case SyntaxKind::ParameterSuffix: {
            TY_AT_TOP(auto ty, Action::Quit);
            switch (ty->kind()) {
                case TypeKind::Function:
                    diagReporter_.FunctionReturningFunction(
                                node->innerDeclarator()->firstToken());
                    break;

                case TypeKind::Array:
                    diagReporter_.FunctionReturningArray(
                                node->innerDeclarator()->firstToken());
                    break;

                case TypeKind::Pointer:
                case TypeKind::Basic:
                case TypeKind::Void:
                case TypeKind::Qualified:
                case TypeKind::Tag:
                case TypeKind::TypedefName:
                    break;

                case TypeKind::Error:
                    PSY_ASSERT_1(false);
                    return Action::Quit;
            }
            auto funcTy = makeType<FunctionType>(ty);
            pushType(funcTy);
            pendingFuncTys_.push(funcTy);

            VISIT(node->innerDeclarator());
            VISIT(node->attributes_PostDeclarator());
            VISIT(node->initializer());
            pushNewScope(node, ScopeKind::FunctionPrototype, true);
            VISIT(node->suffix());
            popAndStashScope();

            pendingFuncTys_.pop();
            return Action::Skip;
        }

        default:
            PSY_ASSERT_1(false);
            return Action::Quit;
    }
}